

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

acttab * acttab_alloc(int nsymbol,int nterminal)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  acttab *paVar6;
  void *pvVar7;
  ulong uVar8;
  undefined4 extraout_EDX;
  int iVar9;
  uint uVar10;
  size_t __size;
  long lVar11;
  uint *__ptr;
  uint *__ptr_00;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  
  lVar11 = 1;
  iVar4 = 0x38;
  paVar6 = (acttab *)calloc(1,0x38);
  if (paVar6 != (acttab *)0x0) {
    paVar6->nsymbol = nsymbol;
    paVar6->nterminal = nterminal;
    return paVar6;
  }
  acttab_alloc_cold_1();
  iVar3 = *(int *)(lVar11 + 0x24);
  iVar9 = *(int *)(lVar11 + 0x28);
  if (iVar9 <= iVar3) {
    *(int *)(lVar11 + 0x28) = iVar9 + 0x19;
    __ptr = *(uint **)(lVar11 + 0x10);
    __size = (long)iVar9 * 8 + 200;
    pvVar7 = realloc(__ptr,__size);
    iVar3 = (int)__size;
    *(void **)(lVar11 + 0x10) = pvVar7;
    if (pvVar7 == (void *)0x0) {
      acttab_action_cold_1();
      uVar16 = __ptr[1];
      iVar4 = __ptr[0xc] + *__ptr + 1;
      uVar5 = uVar16;
      if ((int)uVar16 <= iVar4) {
        uVar5 = iVar4 + uVar16 + 0x14;
        __ptr[1] = uVar5;
        __ptr_00 = *(uint **)(__ptr + 2);
        pvVar7 = realloc(__ptr_00,(long)(int)uVar5 << 3);
        *(void **)(__ptr + 2) = pvVar7;
        if (pvVar7 == (void *)0x0) {
          acttab_insert_cold_1();
          paVar6 = (acttab *)(ulong)*__ptr_00;
          if (0 < (int)*__ptr_00) {
            do {
              iVar4 = (int)paVar6;
              if (-1 < *(int *)(*(long *)(__ptr_00 + 2) + -8 + (long)paVar6 * 8)) {
                return paVar6;
              }
              paVar6 = (acttab *)(ulong)(iVar4 - 1);
            } while (1 < iVar4);
            paVar6 = (acttab *)0x0;
          }
          return paVar6;
        }
        uVar5 = __ptr[1];
        if ((int)uVar16 < (int)uVar5) {
          memset((void *)((long)pvVar7 + (long)(int)uVar16 * 8),0xff,
                 (ulong)(~uVar16 + uVar5) * 8 + 8);
        }
      }
      if (iVar3 == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = __ptr[6];
      }
      uVar10 = *__ptr;
      if ((int)uVar16 < (int)uVar10) {
        lVar11 = *(long *)(__ptr + 2);
        uVar1 = __ptr[6];
        iVar4 = uVar1 - uVar10;
        uVar14 = (long)(int)uVar10;
        do {
          iVar4 = iVar4 + 1;
          uVar8 = uVar14 - 1;
          if ((*(uint *)(lVar11 + -8 + uVar14 * 8) == uVar1) &&
             (*(uint *)(lVar11 + 4 + uVar8 * 8) == __ptr[7])) {
            uVar2 = __ptr[9];
            if (0 < (long)(int)uVar2) {
              lVar13 = 0;
              do {
                iVar9 = *(int *)(*(long *)(__ptr + 4) + lVar13 * 8);
                uVar15 = (iVar9 - uVar1) + (int)uVar8;
                if (((((int)uVar15 < 0) || ((int)uVar10 <= (int)uVar15)) ||
                    (iVar9 != *(int *)(lVar11 + (ulong)uVar15 * 8))) ||
                   (*(int *)(*(long *)(__ptr + 4) + 4 + lVar13 * 8) !=
                    *(int *)(lVar11 + 4 + (ulong)uVar15 * 8))) goto LAB_00102cfe;
                lVar13 = lVar13 + 1;
              } while ((int)uVar2 != lVar13);
            }
            if ((int)uVar10 < 1) {
              uVar15 = 0;
            }
            else {
              uVar14 = 0;
              uVar15 = 0;
              do {
                iVar9 = *(int *)(lVar11 + uVar14 * 8);
                uVar15 = uVar15 + (iVar4 + (int)uVar14 == iVar9 && -1 < iVar9);
                uVar14 = uVar14 + 1;
              } while (uVar10 != uVar14);
            }
            if (uVar15 == uVar2) goto LAB_00102da7;
          }
LAB_00102cfe:
          uVar14 = uVar8;
        } while ((long)(int)uVar16 < (long)uVar8);
      }
      if (iVar3 == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)__ptr[6];
      }
      uVar14 = (long)(int)uVar5 - (long)(int)__ptr[8];
      iVar4 = (int)uVar8;
      if (iVar4 < (int)uVar14) {
        lVar11 = *(long *)(__ptr + 2);
        uVar8 = (ulong)iVar4;
        iVar4 = -iVar4;
        do {
          if (*(int *)(lVar11 + uVar8 * 8) < 0) {
            if (0 < (long)(int)__ptr[9]) {
              lVar13 = 0;
              do {
                uVar16 = (*(int *)(*(long *)(__ptr + 4) + lVar13 * 8) - __ptr[6]) + (int)uVar8;
                if (((int)uVar16 < 0) || (-1 < *(int *)(lVar11 + (ulong)uVar16 * 8)))
                goto LAB_00102d3b;
                lVar13 = lVar13 + 1;
              } while ((int)__ptr[9] != lVar13);
            }
            if ((int)uVar10 < 1) {
              uVar12 = 0;
            }
            else {
              uVar12 = 0;
              while (__ptr[6] + iVar4 + (int)uVar12 != *(int *)(lVar11 + uVar12 * 8)) {
                uVar12 = uVar12 + 1;
                if (uVar10 == uVar12) goto LAB_00102da7;
              }
            }
            if ((uint)uVar12 == uVar10) goto LAB_00102da7;
          }
LAB_00102d3b:
          uVar8 = uVar8 + 1;
          iVar4 = iVar4 + -1;
        } while ((long)uVar8 < (long)uVar14);
        uVar8 = uVar14 & 0xffffffff;
      }
LAB_00102da7:
      iVar4 = (int)uVar8;
      if (0 < (int)__ptr[9]) {
        lVar11 = 0;
        do {
          iVar9 = (*(int *)(*(long *)(__ptr + 4) + lVar11 * 8) - __ptr[6]) + iVar4;
          *(undefined8 *)(*(long *)(__ptr + 2) + (long)iVar9 * 8) =
               *(undefined8 *)(*(long *)(__ptr + 4) + lVar11 * 8);
          uVar10 = *__ptr;
          if ((int)uVar10 <= iVar9) {
            uVar10 = iVar9 + 1;
            *__ptr = uVar10;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (int)__ptr[9]);
      }
      if ((iVar3 != 0) && ((int)uVar10 <= (int)(__ptr[0xb] + iVar4))) {
        *__ptr = __ptr[0xb] + iVar4 + 1;
      }
      __ptr[9] = 0;
      return (acttab *)(ulong)(iVar4 - __ptr[6]);
    }
    iVar3 = *(int *)(lVar11 + 0x24);
  }
  if (iVar3 == 0) {
    *(int *)(lVar11 + 0x20) = iVar4;
  }
  else {
    if (*(int *)(lVar11 + 0x20) < iVar4) {
      *(int *)(lVar11 + 0x20) = iVar4;
    }
    if (*(int *)(lVar11 + 0x18) <= iVar4) goto LAB_00102b9f;
  }
  *(int *)(lVar11 + 0x18) = iVar4;
  *(undefined4 *)(lVar11 + 0x1c) = extraout_EDX;
LAB_00102b9f:
  lVar13 = *(long *)(lVar11 + 0x10);
  *(int *)(lVar13 + (long)iVar3 * 8) = iVar4;
  *(undefined4 *)(lVar13 + 4 + (long)iVar3 * 8) = extraout_EDX;
  *(uint *)(lVar11 + 0x24) = iVar3 + 1U;
  return (acttab *)(ulong)(iVar3 + 1U);
}

Assistant:

acttab *acttab_alloc(int nsymbol, int nterminal){
  acttab *p = (acttab *) calloc( 1, sizeof(*p) );
  if( p==0 ){
    fprintf(stderr,"Unable to allocate memory for a new acttab.");
    exit(1);
  }
  memset(p, 0, sizeof(*p));
  p->nsymbol = nsymbol;
  p->nterminal = nterminal;
  return p;
}